

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall CoinSelection_Constructor_Test::TestBody(CoinSelection_Constructor_Test *this)

{
  bool bVar1;
  CoinSelection coin_select2;
  CoinSelection coin_select1;
  undefined1 in_stack_ffffffffffffff5f;
  AssertHelper in_stack_ffffffffffffff60;
  Message local_98 [7];
  AssertHelper local_60;
  Message local_58 [11];
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    in_stack_ffffffffffffff5f = testing::internal::AlwaysTrue();
    if ((bool)in_stack_ffffffffffffff5f) {
      cfd::CoinSelection::CoinSelection((CoinSelection *)0x271a79);
      cfd::CoinSelection::~CoinSelection((CoinSelection *)0x271a85);
    }
  }
  else {
    testing::Message::Message(local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x27b,
               "Expected: CoinSelection coin_select1 doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message((Message *)0x271b13);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::CoinSelection::CoinSelection
                ((CoinSelection *)in_stack_ffffffffffffff60.data_,(bool)in_stack_ffffffffffffff5f);
      cfd::CoinSelection::~CoinSelection((CoinSelection *)0x271b90);
    }
  }
  else {
    testing::Message::Message(local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x27c,
               "Expected: CoinSelection coin_select2(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff60,local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff60);
    testing::Message::~Message((Message *)0x271c1e);
  }
  return;
}

Assistant:

TEST(CoinSelection, Constructor)
{
  EXPECT_NO_THROW(CoinSelection coin_select1);
  EXPECT_NO_THROW(CoinSelection coin_select2(false));
}